

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * iutest::detail::StringRemoveComment(string *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  string local_80 [48];
  string local_50 [32];
  size_type local_30;
  size_type pos;
  size_type prev;
  string *local_18;
  string *str_local;
  string *r;
  
  prev._7_1_ = 0;
  local_18 = str;
  str_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pos = 0;
  local_30 = std::__cxx11::string::find((char)local_18,10);
  while (local_30 != -1) {
    local_30 = local_30 + 1;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar1 != '#') {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_18);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
      std::__cxx11::string::~string(local_50);
    }
    pos = local_30;
    local_30 = std::__cxx11::string::find((char)local_18,10);
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if (*pcVar1 != '#') {
    std::__cxx11::string::substr((ulong)local_80,(ulong)local_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string StringRemoveComment(const ::std::string& str)
{
    ::std::string r;
    ::std::string::size_type prev = 0;
    ::std::string::size_type pos = str.find('\n', 0);
    while( pos != ::std::string::npos )
    {
        ++pos;
        if( str[prev] != '#' ) {
            r += str.substr(prev, pos-prev);
        }
        prev = pos;
        pos = str.find('\n', pos);
    }
    if( str[prev] != '#' ) {
        r += str.substr(prev);
    }
    return r;
}